

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O3

BigInt<unsigned_int,_unsigned_long> * __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::operator+=
          (BigInt<unsigned_int,_unsigned_long> *this,BigInt<unsigned_int,_unsigned_long> *x)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  uint *puVar4;
  uint in_EAX;
  pointer puVar5;
  uint *puVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uStack_18;
  
  puVar10 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar5 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar10 == puVar5) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->_values,&x->_values);
    this->_positive = x->_positive;
  }
  else {
    puVar2 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar2 != puVar3) {
      if (this->_positive == x->_positive) {
        uVar7 = (long)puVar5 - (long)puVar10 >> 2;
        uVar9 = (long)puVar3 - (long)puVar2 >> 2;
        puVar5 = puVar2;
        uVar11 = uVar9;
        if (uVar7 < uVar9) {
          puVar5 = puVar10;
          uVar11 = uVar7;
          puVar10 = puVar2;
          uVar7 = uVar9;
        }
        lVar12 = uVar7 * 4;
        do {
          lVar12 = lVar12 + -4;
          if (uVar11 * -4 + lVar12 == -4) {
            if (lVar12 != -4) goto LAB_001057a2;
            break;
          }
        } while (*(int *)((long)puVar10 + lVar12) == -1);
LAB_001057c9:
        uStack_18 = (ulong)in_EAX;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&this->_values,uVar7,(value_type_conflict *)((long)&uStack_18 + 4));
        puVar8 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar8 != puVar4) {
          puVar6 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            uVar7 = (ulong)*puVar6 + *puVar8 + uVar11;
            *puVar6 = (uint)uVar7;
            uVar11 = uVar7 >> 0x20;
            puVar8 = puVar8 + 1;
            puVar6 = puVar6 + 1;
          } while (puVar8 != puVar4);
          if (uVar7 >> 0x20 != 0) {
            do {
              *puVar6 = *puVar6 + 1;
              uVar1 = *puVar6;
              puVar6 = puVar6 + 1;
            } while (uVar1 == 0);
          }
        }
      }
      else {
        this->_positive = (bool)(this->_positive ^ 1);
        operator-=(this,x);
        this->_positive = (bool)(this->_positive ^ 1);
      }
    }
  }
  return this;
LAB_001057a2:
  uVar11 = (ulong)*(uint *)((long)puVar10 + lVar12) + (ulong)*(uint *)((long)puVar5 + lVar12);
  if (uVar11 >> 0x20 != 0) {
    uVar7 = uVar7 + 1;
    goto LAB_001057c9;
  }
  if ((lVar12 == 0) || (lVar12 = lVar12 + -4, uVar11 != 0xffffffff)) goto LAB_001057c9;
  goto LAB_001057a2;
}

Assistant:

constexpr BigInt<TBase, TBuffer>& BigInt<TBase, TBuffer>::operator+=(const BigInt<TBase, TBuffer>& x)
	{
		// If this == 0, return x

		if (_values.empty())
		{
			_values = x._values;
			_positive = x._positive;
			return *this;
		}

		// If x == 0, return this

		if (x._values.empty())
		{
			return *this;
		}

		// If this and x are not the same sign, perform a substraction

		if (_positive != x._positive)
		{
			_positive = !_positive;
			*this -= x;
			_positive = !_positive;
			return *this;
		}

		// Identifying the "biggest" number (the one with the most "digits")

		uint64_t sizeBig;
		uint64_t sizeSmall;
		const TBase* itBigBeg;
		const TBase* itSmallBeg;
		if (_values.size() >= x._values.size())
		{
			sizeBig = _values.size();
			sizeSmall = x._values.size();
			itBigBeg = _values.data();
			itSmallBeg = x._values.data();
		}
		else
		{
			sizeBig = x._values.size();
			sizeSmall = _values.size();
			itBigBeg = x._values.data();
			itSmallBeg = _values.data();
		}

		// Finding if an additional digit is necessary

		const TBase* itBig = itBigBeg + sizeBig - 1;
		const TBase* itSmall = itSmallBeg + sizeBig - 1;
		const TBase* itSmallEnd = itSmallBeg + sizeSmall - 1;
		while (itSmall != itSmallEnd && *itBig == _baseMax)
		{
			--itSmall;
			--itBig;
		}

		TBuffer buffer = _baseMax;
		uint64_t newSize = sizeBig;

		if (itSmall == itSmallEnd)
		{
			itSmallEnd = itSmallBeg - 1;
			while (itSmall != itSmallEnd && buffer == _baseMax)
			{
				buffer = static_cast<TBuffer>(*itSmall) + static_cast<TBuffer>(*itBig);
				if (buffer > _baseMax)
				{
					++newSize;
					break;
				}

				--itSmall;
				--itBig;
			}
		}

		// Compute the addition

		_values.resize(newSize, 0);
		itSmall = x._values.data();
		sizeSmall = x._values.size();

		itSmallEnd = itSmall + sizeSmall;

		TBase* itOut = _values.data();
		buffer = 0;
		while (itSmall != itSmallEnd)
		{
			buffer += static_cast<TBuffer>(*itSmall) + static_cast<TBuffer>(*itOut);
			*itOut = buffer & _bufferLowFilter;
			buffer >>= _baseBitSize;

			++itSmall;
			++itOut;
		}

		while (buffer != 0)
		{
			buffer += *itOut;
			*itOut = buffer & _bufferLowFilter;
			buffer >>= _baseBitSize;

			++itOut;
		}

		return *this;
	}